

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O2

void test_all<signed_char,std::function<std::chrono::duration<long,std::ratio<1l,1000000000l>>(std::vector<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000000000l>>>>)>,std::function<std::vector<signed_char,std::allocator<signed_char>>(std::vector<signed_char,std::allocator<signed_char>>)>>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *to_bench,size_t attempts,
               function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>
               *statistic,
               function<std::vector<signed_char,_std::allocator<signed_char>_>_(std::vector<signed_char,_std::allocator<signed_char>_>)>
               *prepare)

{
  key_type *pkVar1;
  iterator iVar2;
  error *this;
  long lVar3;
  key_type *__k;
  undefined1 local_6ee;
  undefined1 local_6ed;
  undefined1 local_6ec;
  anon_class_1_0_00000001 boost_spreadsort;
  anon_class_1_0_00000001 std_stable_sort;
  anon_class_1_0_00000001 std_sort;
  vector<signed_char,_std::allocator<signed_char>_> numbers;
  anon_class_8_1_4eff857e radix_sort_par_16;
  anon_class_8_1_4eff857e radix_sort_par_8;
  anon_class_8_1_4eff857e radix_sort_par_4;
  anon_class_8_1_4eff857e radix_sort_par_2;
  anon_class_8_1_4eff857e radix_sort_par_max;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  local_688;
  anon_class_8_1_4eff857e radix_sort;
  vector<signed_char,_std::allocator<signed_char>_> buffer;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>_>_>
  sort_calls;
  function<std::vector<signed_char,_std::allocator<signed_char>_>_(std::vector<signed_char,_std::allocator<signed_char>_>)>
  local_5f0;
  function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>
  local_5d0;
  function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>
  local_5b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  local_590;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  local_550;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  local_510;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  local_4d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  local_490;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  local_450;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  local_410;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> error_message;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  local_330;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  local_2d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  local_270;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  local_210;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  local_150;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  local_90;
  
  numbers.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  numbers.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  numbers.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  utility::read<std::vector<signed_char,std::allocator<signed_char>>>((istream *)&std::cin,&numbers)
  ;
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            (&buffer,(long)numbers.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)numbers.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                           _M_impl.super__Vector_impl_data._M_start,(allocator_type *)&error_message
            );
  radix_sort_par_16.buffer = &buffer;
  radix_sort_par_8.buffer = &buffer;
  radix_sort_par_4.buffer = &buffer;
  radix_sort_par_2.buffer = &buffer;
  radix_sort_par_max.buffer = &buffer;
  radix_sort.buffer = &buffer;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  ::
  pair<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_benchmark_burst_algorithm_radix_sort_cpp:99:9)_&,_true>
            (&local_688,&burst_radix_sort_call_name_abi_cxx11_,&radix_sort);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
              *)&error_message,&burst_radix_sort_title_abi_cxx11_,&local_688);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  ::
  pair<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_benchmark_burst_algorithm_radix_sort_cpp:104:9)_&,_true>
            (&local_3d0,&burst_radix_sort_par_max_call_name_abi_cxx11_,&radix_sort_par_max);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>,_true>
            (&local_330,&burst_radix_sort_par_max_title_abi_cxx11_,&local_3d0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  ::
  pair<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_benchmark_burst_algorithm_radix_sort_cpp:110:9)_&,_true>
            (&local_410,&burst_radix_sort_par_2_call_name_abi_cxx11_,&radix_sort_par_2);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>,_true>
            (&local_2d0,&burst_radix_sort_par_2_title_abi_cxx11_,&local_410);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  ::
  pair<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_benchmark_burst_algorithm_radix_sort_cpp:115:9)_&,_true>
            (&local_450,&burst_radix_sort_par_4_call_name_abi_cxx11_,&radix_sort_par_4);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>,_true>
            (&local_270,&burst_radix_sort_par_4_title_abi_cxx11_,&local_450);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  ::
  pair<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_benchmark_burst_algorithm_radix_sort_cpp:120:9)_&,_true>
            (&local_490,&burst_radix_sort_par_8_call_name_abi_cxx11_,&radix_sort_par_8);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>,_true>
            (&local_210,&burst_radix_sort_par_8_title_abi_cxx11_,&local_490);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  ::
  pair<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_benchmark_burst_algorithm_radix_sort_cpp:125:9)_&,_true>
            (&local_4d0,&burst_radix_sort_par_16_call_name_abi_cxx11_,&radix_sort_par_16);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>,_true>
            (&local_1b0,&burst_radix_sort_par_16_title_abi_cxx11_,&local_4d0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  ::
  pair<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_benchmark_burst_algorithm_radix_sort_cpp:130:9)_&,_true>
            (&local_510,&std_sort_call_name_abi_cxx11_,&std_sort);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>,_true>
            (&local_150,&std_sort_title_abi_cxx11_,&local_510);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  ::
  pair<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_benchmark_burst_algorithm_radix_sort_cpp:135:9)_&,_true>
            (&local_550,&std_stable_sort_call_name_abi_cxx11_,&std_stable_sort);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>,_true>
            (&local_f0,&std_stable_sort_title_abi_cxx11_,&local_550);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  ::
  pair<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_benchmark_burst_algorithm_radix_sort_cpp:140:9)_&,_true>
            (&local_590,&boost_spreadsort_call_name_abi_cxx11_,&boost_spreadsort);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>,_true>
            (&local_90,&boost_spreadsort_title_abi_cxx11_,&local_590);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::__cxx11::string,std::function<void(__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>)>>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::__cxx11::string,std::function<void(__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>)>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _Hashtable<std::pair<std::__cxx11::string_const,std::pair<std::__cxx11::string,std::function<void(__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>)>>>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::__cxx11::string,std::function<void(__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>)>>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::__cxx11::string,std::function<void(__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>)>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&sort_calls,&error_message,&stack0xffffffffffffffd0,0,&local_6ec,&local_6ed,
             &local_6ee);
  lVar3 = 0x300;
  do {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
             *)((long)&error_message._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x60;
  } while (lVar3 != -0x60);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  ::~pair(&local_590);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  ::~pair(&local_550);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  ::~pair(&local_510);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  ::~pair(&local_4d0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  ::~pair(&local_490);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  ::~pair(&local_450);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  ::~pair(&local_410);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  ::~pair(&local_3d0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  ::~pair(&local_688);
  __k = (to_bench->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  pkVar1 = (to_bench->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (__k == pkVar1) {
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&sort_calls._M_h);
      std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
                (&buffer.super__Vector_base<signed_char,_std::allocator<signed_char>_>);
      std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
                (&numbers.super__Vector_base<signed_char,_std::allocator<signed_char>_>);
      return;
    }
    iVar2 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&sort_calls._M_h,__k);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>,_true>
        ._M_cur == (__node_type *)0x0) break;
    std::
    function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>
    ::function(&local_5b0,
               (function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>
                *)((long)iVar2.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>,_true>
                         ._M_cur + 0x48));
    std::
    function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>
    ::function(&local_5d0,statistic);
    std::
    function<std::vector<signed_char,_std::allocator<signed_char>_>_(std::vector<signed_char,_std::allocator<signed_char>_>)>
    ::function(&local_5f0,prepare);
    test_sort<std::function<void(__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>)>,std::vector<signed_char,std::allocator<signed_char>>,std::function<std::chrono::duration<long,std::ratio<1l,1000000000l>>(std::vector<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000000000l>>>>)>,std::function<std::vector<signed_char,std::allocator<signed_char>>(std::vector<signed_char,std::allocator<signed_char>>)>>
              ((string *)
               ((long)iVar2.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>,_true>
                      ._M_cur + 0x28),&local_5b0,&numbers,attempts,&local_5d0,&local_5f0);
    std::_Function_base::~_Function_base(&local_5f0.super__Function_base);
    std::_Function_base::~_Function_base(&local_5d0.super__Function_base);
    std::_Function_base::~_Function_base(&local_5b0.super__Function_base);
    __k = __k + 1;
  }
  burst::literals::operator____u8s_abi_cxx11_(&local_688.first,anon_var_dwarf_f14d7,0x45);
  std::operator+(&error_message,&local_688.first,__k);
  std::__cxx11::string::~string((string *)&local_688);
  this = (error *)__cxa_allocate_exception(0x10);
  boost::program_options::error::error(this,&error_message);
  __cxa_throw(this,&boost::program_options::error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
    test_all
    (
        const std::vector<std::string> & to_bench,
        std::size_t attempts,
        UnaryFunction1 statistic,
        UnaryFunction2 prepare
    )
{
    std::vector<Value> numbers;
    utility::read(std::cin, numbers);

    std::vector<Value> buffer(numbers.size());

    auto radix_sort =
        [& buffer] (auto && ... args)
        {
            return burst::radix_sort(std::forward<decltype(args)>(args)..., buffer.begin(), burst::to_ordered_integral);
        };
    auto radix_sort_par_max =
        [& buffer] (auto && ... args)
        {
            const auto par = burst::par(std::max(std::thread::hardware_concurrency(), 2u));
            return burst::radix_sort(par, std::forward<decltype(args)>(args)..., buffer.begin(), burst::to_ordered_integral);
        };
    auto radix_sort_par_2 =
        [& buffer] (auto && ... args)
        {
            return burst::radix_sort(burst::par(2), std::forward<decltype(args)>(args)..., buffer.begin(), burst::to_ordered_integral);
        };
    auto radix_sort_par_4 =
        [& buffer] (auto && ... args)
        {
            return burst::radix_sort(burst::par(4), std::forward<decltype(args)>(args)..., buffer.begin(), burst::to_ordered_integral);
        };
    auto radix_sort_par_8 =
        [& buffer] (auto && ... args)
        {
            return burst::radix_sort(burst::par(8), std::forward<decltype(args)>(args)..., buffer.begin(), burst::to_ordered_integral);
        };
    auto radix_sort_par_16 =
        [& buffer] (auto && ... args)
        {
            return burst::radix_sort(burst::par(16), std::forward<decltype(args)>(args)..., buffer.begin(), burst::to_ordered_integral);
        };
    auto std_sort =
        [] (auto && ... args)
        {
            return std::sort(std::forward<decltype(args)>(args)...);
        };
    auto std_stable_sort =
        [] (auto && ... args)
        {
            return std::stable_sort(std::forward<decltype(args)>(args)...);
        };
    auto boost_spreadsort =
        [] (auto && ... args)
        {
            return boost::sort::spreadsort::spreadsort(std::forward<decltype(args)>(args)...);
        };

    using iterator_type = typename std::vector<Value>::iterator;
    using sort_call_type = std::function<void(iterator_type, iterator_type)>;
    auto sort_calls =
        std::unordered_map<std::string, std::pair<std::string, sort_call_type>>
        {
            {burst_radix_sort_title, {burst_radix_sort_call_name, radix_sort}},
            {burst_radix_sort_par_max_title, {burst_radix_sort_par_max_call_name, radix_sort_par_max}},
            {burst_radix_sort_par_2_title, {burst_radix_sort_par_2_call_name, radix_sort_par_2}},
            {burst_radix_sort_par_4_title, {burst_radix_sort_par_4_call_name, radix_sort_par_4}},
            {burst_radix_sort_par_8_title, {burst_radix_sort_par_8_call_name, radix_sort_par_8}},
            {burst_radix_sort_par_16_title, {burst_radix_sort_par_16_call_name, radix_sort_par_16}},
            {std_sort_title, {std_sort_call_name, std_sort}},
            {std_stable_sort_title, {std_stable_sort_call_name, std_stable_sort}},
            {boost_spreadsort_title, {boost_spreadsort_call_name, boost_spreadsort}}
        };

    for (const auto & sort_call_title: to_bench)
    {
        auto call_params = sort_calls.find(sort_call_title);
        if (call_params != sort_calls.end())
        {
            const auto & name = call_params->second.first;
            const auto & call = call_params->second.second;
            test_sort(name, call, numbers, attempts, statistic, prepare);
        }
        else
        {
            const auto error_message =
                u8"Неверный тип тестируемого алгоритма: "_u8s + sort_call_title;
            throw boost::program_options::error(error_message);
        }
    }
}